

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostBend.cpp
# Opt level: O2

void __thiscall OpenMD::GhostBend::calcForce(GhostBend *this,RealType *angle,bool doParticlePot)

{
  RealType *particlePot;
  pointer ppAVar1;
  Atom *this_00;
  BendType *pBVar2;
  Vector<double,_3U> *v1;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double __x;
  RealType dVdTheta;
  Vector<double,_3U> local_198;
  Vector<double,_3U> local_180;
  Vector3d r23;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector3d r21;
  Vector<double,_3U> local_108;
  Vector3d force3;
  Vector3d force1;
  Vector3d pos2;
  Vector3d pos1;
  
  ppAVar1 = (this->super_Bend).super_ShortRangeInteraction.atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = ppAVar1[1];
  StuntDouble::getPos((Vector3d *)&pos1.super_Vector<double,_3U>,&(*ppAVar1)->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&pos2.super_Vector<double,_3U>,&this_00->super_StuntDouble);
  operator-(&force1.super_Vector<double,_3U>,&pos1.super_Vector<double,_3U>,
            &pos2.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&r21.super_Vector<double,_3U>,&force1.super_Vector<double,_3U>);
  Snapshot::wrapVector
            (((this->super_Bend).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             (Vector3d *)&r21.super_Vector<double,_3U>);
  dVar3 = Vector<double,_3U>::length(&r21.super_Vector<double,_3U>);
  StuntDouble::getA((RotMat3x3d *)&force3,&this_00->super_StuntDouble);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&force1,(RotMat3x3d *)&force3);
  RectMatrix<double,_3U,_3U>::getColumn(&local_198,(RectMatrix<double,_3U,_3U> *)&force1,2);
  Vector<double,_3U>::Vector(&r23.super_Vector<double,_3U>,&local_198);
  dVar4 = Vector<double,_3U>::length(&r23.super_Vector<double,_3U>);
  dVar5 = dot<double,3u>(&r21.super_Vector<double,_3U>,&r23.super_Vector<double,_3U>);
  dVar5 = dVar5 / (dVar3 * dVar4);
  __x = 1.0;
  if ((dVar5 <= 1.0) && (__x = dVar5, dVar5 < -1.0)) {
    __x = -1.0;
  }
  dVar3 = 1.0 / dVar3;
  dVar4 = 1.0 / dVar4;
  dVar5 = acos(__x);
  pBVar2 = (this->super_Bend).bendType_;
  particlePot = &(this->super_Bend).potential_;
  (*pBVar2->_vptr_BendType[2])(pBVar2,particlePot,&dVdTheta);
  dVar6 = 1.0 - __x * __x;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = dVdTheta /
          (double)(~-(ulong)(ABS(dVar6) < 1e-06) & (ulong)dVar6 |
                  -(ulong)(ABS(dVar6) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  operator*(&local_180,&r23.super_Vector<double,_3U>,dVar4);
  operator*(&local_150,&r21.super_Vector<double,_3U>,dVar3);
  operator*(&local_138,&local_150,__x);
  operator-(&local_198,&local_180,&local_138);
  operator*(&force3.super_Vector<double,_3U>,dVar3 * dVar6,&local_198);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&force1,&force3.super_Vector<double,_3U>);
  operator*(&local_138,&r21.super_Vector<double,_3U>,dVar3);
  operator*(&local_108,&r23.super_Vector<double,_3U>,dVar4);
  operator*(&local_150,&local_108,__x);
  operator-(&local_180,&local_138,&local_150);
  operator*(&local_198,dVar6 * dVar4,&local_180);
  Vector<double,_3U>::Vector(&force3.super_Vector<double,_3U>,&local_198);
  StuntDouble::addFrc(&(*(this->super_Bend).super_ShortRangeInteraction.atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble,&force1);
  operator-(&local_180,(OpenMD *)&force1,v1);
  Vector<double,_3U>::Vector(&local_198,&local_180);
  StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)&local_198);
  cross<double>((Vector3<double> *)&local_198,&r23,
                (Vector3<double> *)&force3.super_Vector<double,_3U>);
  StuntDouble::addTrq(&this_00->super_StuntDouble,(Vector3d *)&local_198);
  if (doParticlePot) {
    StuntDouble::addParticlePot
              (&(*(this->super_Bend).super_ShortRangeInteraction.atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot(&this_00->super_StuntDouble,particlePot);
  }
  *angle = (dVar5 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void GhostBend::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[1]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    RealType d21 = r21.length();

    RealType d21inv = 1.0 / d21;

    // we need the transpose of A to get the lab fixed vector:
    Vector3d r23 = ghostAtom->getA().transpose().getColumn(2);
    RealType d23 = r23.length();

    RealType d23inv = 1.0 / d23;

    RealType cosTheta = dot(r21, r23) / (d21 * d23);

    // check roundoff
    if (cosTheta > 1.0) {
      cosTheta = 1.0;
    } else if (cosTheta < -1.0) {
      cosTheta = -1.0;
    }

    RealType theta = acos(cosTheta);

    RealType dVdTheta;

    bendType_->calcForce(theta, potential_, dVdTheta);

    RealType sinTheta = sqrt(1.0 - cosTheta * cosTheta);

    if (fabs(sinTheta) < 1.0E-6) { sinTheta = 1.0E-6; }

    RealType commonFactor1 = dVdTheta / sinTheta * d21inv;
    RealType commonFactor2 = dVdTheta / sinTheta * d23inv;

    Vector3d force1 = commonFactor1 * (r23 * d23inv - r21 * d21inv * cosTheta);
    Vector3d force3 = commonFactor2 * (r21 * d21inv - r23 * d23inv * cosTheta);

    // Total force in current bend is zero

    atoms_[0]->addFrc(force1);
    ghostAtom->addFrc(-force1);

    ghostAtom->addTrq(cross(r23, force3));
    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = theta / Constants::PI * 180.0;
  }